

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnBrOnExn(TypeChecker *this,Index depth,TypeVector *types)

{
  Result RVar1;
  Result RVar2;
  TypeVector *prefix;
  TypeChecker *this_00;
  _anonymous_namespace_ *this_01;
  Label *label;
  string local_70;
  string local_50;
  
  RVar1 = PopAndCheck1Type(this,(Type)0xffffffe8,"br_on_exn");
  this_00 = this;
  RVar2 = GetLabel(this,depth,&label);
  if (RVar2.enum_ == Error) {
    RVar1.enum_ = Error;
  }
  else {
    prefix = &label->param_types;
    this_01 = (_anonymous_namespace_ *)&label->result_types;
    if (label->label_type == Loop) {
      this_01 = (_anonymous_namespace_ *)prefix;
    }
    RVar2 = CheckTypes(this_00,types,(TypeVector *)this_01);
    if (RVar2.enum_ == Error) {
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_50,this_01,(TypeVector *)0x0,(char *)prefix);
      (anonymous_namespace)::TypesToString_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)types,(TypeVector *)0x0,(char *)prefix);
      PrintError(this,"br_on_exn has inconsistent types: expected %s, got %s",
                 local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      RVar1.enum_ = Error;
    }
    PushType(this,(Type)0xffffffe8);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnBrOnExn(Index depth, const TypeVector& types) {
  Result result = PopAndCheck1Type(Type::ExnRef, "br_on_exn");
  Label* label;
  CHECK_RESULT(GetLabel(depth, &label));
  if (Failed(CheckTypes(types, label->br_types()))) {
    PrintError("br_on_exn has inconsistent types: expected %s, got %s",
               TypesToString(label->br_types()).c_str(),
               TypesToString(types).c_str());
    result = Result::Error;
  }
  PushType(Type::ExnRef);
  return result;
}